

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O3

bool __thiscall CMU462::Timeline::unmarkTime(Timeline *this,int time)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar4;
  int local_c;
  
  p_Var1 = (this->times)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var3 = &(this->times)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var3->_M_header;
    do {
      if (time <= (int)p_Var1[1]._M_color) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < time];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var3) && ((int)p_Var2[1]._M_color <= time)) {
      local_c = time;
      pVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              equal_range(&(this->times)._M_t,&local_c);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(&(this->times)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
      return true;
    }
  }
  return false;
}

Assistant:

bool Timeline::unmarkTime(int time) {
  if (times.find(time) != times.end()) {
    times.erase(time);
    return true;
  }

  return false;
}